

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O3

void __thiscall OpenMD::SimInfo::SimInfo(SimInfo *this,ForceField *ff,Globals *simParams)

{
  _Rb_tree_header *p_Var1;
  pointer ppIVar2;
  pointer ppTVar3;
  pointer ppBVar4;
  pointer ppIVar5;
  pointer ppTVar6;
  pointer ppBVar7;
  uint nmol;
  Component *pCVar8;
  MoleculeStamp *molStamp;
  pointer ppCVar9;
  CutoffGroupStamp *pCVar10;
  pointer ppRVar11;
  RigidBodyStamp *pRVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 auVar13 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  vector<int,_std::allocator<int>_> *pvVar22;
  int iVar23;
  pointer ppCVar24;
  vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_> components;
  uint_fast32_t seed;
  undefined1 local_b1;
  vector<int,_std::allocator<int>_> *local_b0;
  int local_a4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_> local_70;
  undefined1 local_58 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_50 [2];
  LocalIndexManager *local_40;
  unsigned_long local_38;
  
  this->_vptr_SimInfo = (_func_int **)&PTR__SimInfo_002fc450;
  this->forceField_ = ff;
  this->simParams_ = simParams;
  this->ndf_ = 0;
  this->fdf_local = 0;
  this->ndfRaw_ = 0;
  this->ndfTrans_ = 0;
  this->nZconstraint_ = 0;
  p_Var1 = &(this->molecules_)._M_t._M_impl.super__Rb_tree_header;
  (this->molecules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->molecules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->randNumGen_).super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2> =
       (__shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>)0x0;
  this->nAtoms_ = 0;
  this->nBonds_ = 0;
  this->nBends_ = 0;
  this->nTorsions_ = 0;
  this->nInversions_ = 0;
  this->nRigidBodies_ = 0;
  this->nIntegrableObjects_ = 0;
  this->nCutoffGroups_ = 0;
  this->nConstraints_ = 0;
  this->nFluctuatingCharges_ = 0;
  this->nGlobalMols_ = 0;
  this->nGlobalAtoms_ = 0;
  this->nGlobalCutoffGroups_ = 0;
  this->nGlobalIntegrableObjects_ = 0;
  this->nGlobalRigidBodies_ = 0;
  this->nGlobalFluctuatingCharges_ = 0;
  this->nGlobalBonds_ = 0;
  this->nGlobalBends_ = 0;
  this->nGlobalTorsions_ = 0;
  this->nGlobalInversions_ = 0;
  *(undefined8 *)((long)&this->nGlobalInversions_ + 1) = 0;
  (this->molecules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->molecules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->excludedInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header;
  (this->excludedInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->excludedInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  memset(&(this->molecules_)._M_t._M_impl.super__Rb_tree_header._M_node_count,0,0xb0);
  (this->excludedInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->excludedInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  *(undefined1 (*) [16])
   &(this->excludedInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (undefined1  [16])0x0;
  pvVar22 = &(this->excludedInteractions_).pairList_;
  (pvVar22->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  (pvVar22->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->excludedInteractions_).modified_ = false;
  p_Var1 = &(this->oneTwoInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header;
  (this->oneTwoInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->oneTwoInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->oneTwoInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->oneTwoInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  *(undefined1 (*) [16])
   &(this->oneTwoInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (undefined1  [16])0x0;
  pvVar22 = &(this->oneTwoInteractions_).pairList_;
  (pvVar22->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  (pvVar22->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->oneTwoInteractions_).modified_ = false;
  p_Var1 = &(this->oneThreeInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header;
  (this->oneThreeInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->oneThreeInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->oneThreeInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->oneThreeInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  *(undefined1 (*) [16])
   &(this->oneThreeInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (undefined1  [16])0x0;
  pvVar22 = &(this->oneThreeInteractions_).pairList_;
  (pvVar22->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  (pvVar22->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->oneThreeInteractions_).modified_ = false;
  p_Var1 = &(this->oneFourInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header;
  (this->oneFourInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->oneFourInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->oneFourInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->oneFourInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  *(undefined1 (*) [16])
   &(this->oneFourInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (undefined1  [16])0x0;
  pvVar22 = &(this->oneFourInteractions_).pairList_;
  (pvVar22->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  (pvVar22->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->oneFourInteractions_).modified_ = false;
  (this->properties_)._vptr_PropertyMap = (_func_int **)&PTR__PropertyMap_002fc480;
  p_Var1 = &(this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header;
  (this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  *(undefined1 (*) [16])
   &(this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (undefined1  [16])0x0;
  LocalIndexManager::LocalIndexManager(&this->localIndexMan_);
  local_78 = &(this->rawMetaData_).field_2;
  (this->rawMetaData_)._M_dataplus._M_p = (pointer)local_78;
  (this->rawMetaData_)._M_string_length = 0;
  (this->rawMetaData_).field_2._M_local_buf[0] = '\0';
  local_80 = &(this->finalConfigFileName_).field_2;
  (this->finalConfigFileName_)._M_dataplus._M_p = (pointer)local_80;
  (this->finalConfigFileName_)._M_string_length = 0;
  (this->finalConfigFileName_).field_2._M_local_buf[0] = '\0';
  local_88 = &(this->dumpFileName_).field_2;
  (this->dumpFileName_)._M_dataplus._M_p = (pointer)local_88;
  (this->dumpFileName_)._M_string_length = 0;
  (this->dumpFileName_).field_2._M_local_buf[0] = '\0';
  local_90 = &(this->statFileName_).field_2;
  (this->statFileName_)._M_dataplus._M_p = (pointer)local_90;
  (this->statFileName_)._M_string_length = 0;
  (this->statFileName_).field_2._M_local_buf[0] = '\0';
  local_98 = &(this->reportFileName_).field_2;
  (this->reportFileName_)._M_dataplus._M_p = (pointer)local_98;
  (this->reportFileName_)._M_string_length = 0;
  (this->reportFileName_).field_2._M_local_buf[0] = '\0';
  local_a0 = &(this->restFileName_).field_2;
  (this->restFileName_)._M_dataplus._M_p = (pointer)local_a0;
  (this->restFileName_)._M_string_length = 0;
  (this->restFileName_).field_2._M_local_buf[0] = '\0';
  this->topologyDone_ = false;
  this->calcBoxDipole_ = false;
  this->calcBoxQuadrupole_ = false;
  this->useAtomicVirial_ = true;
  pvVar22 = &this->molToProcMap_;
  (this->molToProcMap_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->molToProcMap_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->IOIndexToIntegrableObject).
    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (this->IOIndexToIntegrableObject).
  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->IOIndexToIntegrableObject).
  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_40 = &this->localIndexMan_;
  std::vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>::vector
            (&local_70,&simParams->components_);
  if (local_70.super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>._M_impl
      .super__Vector_impl_data._M_start ==
      local_70.super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    iVar15 = this->nGlobalAtoms_;
    iVar20 = this->nGlobalRigidBodies_;
    iVar17 = 0;
    iVar23 = 0;
  }
  else {
    iVar17 = 0;
    iVar18 = 0;
    iVar23 = 0;
    ppCVar24 = local_70.
               super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    local_b0 = pvVar22;
    do {
      pCVar8 = *ppCVar24;
      iVar15 = -1;
      if ((pCVar8->Region).super_ParameterBase.empty_ == false) {
        iVar15 = *(int *)&(pCVar8->Region).super_ParameterBase.field_0x2c;
      }
      molStamp = pCVar8->moleculeStamp_;
      molStamp->region_ = iVar15;
      nmol = *(uint *)&(pCVar8->NMol).super_ParameterBase.field_0x2c;
      local_a4 = iVar17;
      addMoleculeStamp(this,molStamp,nmol);
      iVar15 = (int)((ulong)((long)(molStamp->atomStamps_).
                                   super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(molStamp->atomStamps_).
                                  super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) * nmol +
               this->nGlobalAtoms_;
      this->nGlobalAtoms_ = iVar15;
      ppIVar2 = (molStamp->inversionStamps_).
                super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      ppTVar3 = (molStamp->torsionStamps_).
                super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      ppBVar4 = (molStamp->bendStamps_).
                super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      ppIVar5 = (molStamp->inversionStamps_).
                super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppTVar6 = (molStamp->torsionStamps_).
                super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppBVar7 = (molStamp->bendStamps_).
                super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      this->nGlobalBonds_ =
           (int)(((ulong)((long)(molStamp->bondStamps_).
                                super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(molStamp->bondStamps_).
                               super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff) *
                (ulong)nmol) + this->nGlobalBonds_;
      this->nGlobalBends_ =
           (int)(((ulong)((long)ppBVar4 - (long)ppBVar7) >> 3 & 0xffffffff) * (ulong)nmol) +
           this->nGlobalBends_;
      this->nGlobalTorsions_ =
           (int)(((ulong)((long)ppTVar3 - (long)ppTVar6) >> 3 & 0xffffffff) * (ulong)nmol) +
           this->nGlobalTorsions_;
      this->nGlobalInversions_ =
           (int)(((ulong)((long)ppIVar2 - (long)ppIVar5) >> 3 & 0xffffffff) * (ulong)nmol) +
           this->nGlobalInversions_;
      ppCVar9 = (molStamp->cutoffGroupStamps_).
                super__Vector_base<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      iVar17 = 0;
      iVar20 = 0;
      uVar19 = (uint)((ulong)((long)(molStamp->cutoffGroupStamps_).
                                    super__Vector_base<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar9) >> 3
                     );
      if (0 < (int)uVar19) {
        uVar21 = 0;
        iVar20 = 0;
        do {
          pCVar10 = ppCVar9[uVar21];
          iVar20 = iVar20 + (int)((ulong)((long)*(pointer *)
                                                 ((long)&(pCVar10->members_).
                                                                                                                  
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + 8) -
                                         *(long *)&(pCVar10->members_).
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data) >> 2);
          uVar21 = uVar21 + 1;
        } while ((uVar19 & 0x7fffffff) != uVar21);
      }
      ppRVar11 = (molStamp->rigidBodyStamps_).
                 super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      uVar16 = (uint)((ulong)((long)(molStamp->rigidBodyStamps_).
                                    super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppRVar11) >>
                     3);
      if (0 < (int)uVar16) {
        uVar21 = 0;
        iVar17 = 0;
        do {
          pRVar12 = ppRVar11[uVar21];
          iVar17 = iVar17 + (int)((ulong)((long)*(pointer *)
                                                 ((long)&(pRVar12->members_).
                                                                                                                  
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + 8) -
                                         *(long *)&(pRVar12->members_).
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data) >> 2);
          uVar21 = uVar21 + 1;
        } while ((uVar16 & 0x7fffffff) != uVar21);
      }
      iVar23 = iVar23 + nmol * uVar19;
      iVar18 = iVar18 + iVar20 * nmol;
      iVar20 = uVar16 * nmol + this->nGlobalRigidBodies_;
      this->nGlobalRigidBodies_ = iVar20;
      iVar17 = local_a4 + iVar17 * nmol;
      ppCVar24 = ppCVar24 + 1;
    } while (ppCVar24 !=
             local_70.super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
    iVar23 = iVar23 - iVar18;
    pvVar22 = local_b0;
  }
  this->nGlobalCutoffGroups_ = iVar23 + iVar15;
  this->nGlobalIntegrableObjects_ = (iVar15 - iVar17) + iVar20;
  iVar15 = (int)((ulong)((long)(this->molStampIds_).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->molStampIds_).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 2);
  this->nGlobalMols_ = iVar15;
  std::vector<int,_std::allocator<int>_>::resize(pvVar22,(long)iVar15);
  local_38 = 0x1571;
  if ((this->simParams_->Seed).super_ParameterBase.empty_ == false) {
    local_38 = (this->simParams_->Seed).data_;
  }
  local_58 = (undefined1  [8])0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::Utils::RandNumGen,std::allocator<OpenMD::Utils::RandNumGen>,unsigned_long&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8),(RandNumGen **)local_58,
             (allocator<OpenMD::Utils::RandNumGen> *)&local_b1,&local_38);
  _Var14._M_pi = a_Stack_50[0]._M_pi;
  auVar13 = local_58;
  _local_58 = (undefined1  [16])0x0;
  this_00 = (this->randNumGen_).
            super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (this->randNumGen_).super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)auVar13;
  (this->randNumGen_).super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var14._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (a_Stack_50[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_50[0]._M_pi);
    }
  }
  if (local_70.super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.
                    super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.
                          super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.
                          super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

SimInfo::SimInfo(ForceField* ff, Globals* simParams) :
      forceField_(ff), simParams_(simParams), randNumGen_ {nullptr}, nAtoms_(0),
      nBonds_(0), nBends_(0), nTorsions_(0), nInversions_(0), nRigidBodies_(0),
      nIntegrableObjects_(0), nCutoffGroups_(0), nConstraints_(0),
      nFluctuatingCharges_(0), nGlobalMols_(0), nGlobalAtoms_(0),
      nGlobalCutoffGroups_(0), nGlobalIntegrableObjects_(0),
      nGlobalRigidBodies_(0), nGlobalFluctuatingCharges_(0), nGlobalBonds_(0),
      nGlobalBends_(0), nGlobalTorsions_(0), nGlobalInversions_(0),
      nGlobalConstraints_(0), hasNGlobalConstraints_(false), ndf_(0),
      fdf_local(0), ndfRaw_(0), ndfTrans_(0), nZconstraint_(0), sman_(NULL),
      topologyDone_(false), calcBoxDipole_(false), calcBoxQuadrupole_(false),
      useAtomicVirial_(true) {
    MoleculeStamp* molStamp;
    int nMolWithSameStamp;
    int nCutoffAtoms = 0;  // number of atoms belong to cutoff groups
    int nGroups      = 0;  // total cutoff groups defined in meta-data file
    CutoffGroupStamp* cgStamp;
    RigidBodyStamp* rbStamp;
    int nRigidAtoms = 0;

    vector<Component*> components = simParams->getComponents();

    for (vector<Component*>::iterator i = components.begin();
         i != components.end(); ++i) {
      molStamp = (*i)->getMoleculeStamp();
      if ((*i)->haveRegion()) {
        molStamp->setRegion((*i)->getRegion());
      } else {
        // set the region to a disallowed value:
        molStamp->setRegion(-1);
      }

      nMolWithSameStamp = (*i)->getNMol();

      addMoleculeStamp(molStamp, nMolWithSameStamp);

      // calculate atoms in molecules
      nGlobalAtoms_ += molStamp->getNAtoms() * nMolWithSameStamp;
      nGlobalBonds_ += molStamp->getNBonds() * nMolWithSameStamp;
      nGlobalBends_ += molStamp->getNBends() * nMolWithSameStamp;
      nGlobalTorsions_ += molStamp->getNTorsions() * nMolWithSameStamp;
      nGlobalInversions_ += molStamp->getNInversions() * nMolWithSameStamp;

      // calculate atoms in cutoff groups
      int nAtomsInGroups       = 0;
      int nCutoffGroupsInStamp = molStamp->getNCutoffGroups();

      for (int j = 0; j < nCutoffGroupsInStamp; j++) {
        cgStamp = molStamp->getCutoffGroupStamp(j);
        nAtomsInGroups += cgStamp->getNMembers();
      }

      nGroups += nCutoffGroupsInStamp * nMolWithSameStamp;

      nCutoffAtoms += nAtomsInGroups * nMolWithSameStamp;

      // calculate atoms in rigid bodies
      int nAtomsInRigidBodies = 0;
      int nRigidBodiesInStamp = molStamp->getNRigidBodies();

      for (int j = 0; j < nRigidBodiesInStamp; j++) {
        rbStamp = molStamp->getRigidBodyStamp(j);
        nAtomsInRigidBodies += rbStamp->getNMembers();
      }

      nGlobalRigidBodies_ += nRigidBodiesInStamp * nMolWithSameStamp;
      nRigidAtoms += nAtomsInRigidBodies * nMolWithSameStamp;
    }

    // every free atom (atom does not belong to cutoff groups) is a cutoff
    // group therefore the total number of cutoff groups in the system is
    // equal to the total number of atoms minus number of atoms belong to
    // cutoff group defined in meta-data file plus the number of cutoff
    // groups defined in meta-data file

    nGlobalCutoffGroups_ = nGlobalAtoms_ - nCutoffAtoms + nGroups;

    // every free atom (atom does not belong to rigid bodies) is an
    // integrable object therefore the total number of integrable objects
    // in the system is equal to the total number of atoms minus number of
    // atoms belong to rigid body defined in meta-data file plus the number
    // of rigid bodies defined in meta-data file
    nGlobalIntegrableObjects_ =
        nGlobalAtoms_ - nRigidAtoms + nGlobalRigidBodies_;

    nGlobalMols_ = molStampIds_.size();
    molToProcMap_.resize(nGlobalMols_);

    // Initialize the random number generator on each processing
    // element using either the user-supplied seed or a default seed
    std::uint_fast32_t seed;

    if (simParams_->haveSeed())
      seed = static_cast<std::uint_fast32_t>(simParams_->getSeed());
    else
      seed = std::mt19937::default_seed;

    randNumGen_ = std::make_shared<Utils::RandNumGen>(seed);
  }